

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# illegal_opcodes.c
# Opt level: O2

uint8_t zeropageX_SRE(cpu_registers *registers)

{
  uint8_t uVar1;
  byte bVar2;
  undefined8 in_RAX;
  uint8_t data;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  uVar1 = fetch_zeropageX(registers);
  uStack_18._7_1_ = uVar1;
  base_shift_right(registers,(uint8_t *)((long)&uStack_18 + 7));
  bVar2 = calc_zeropageX_address(registers);
  base_store((ushort)bVar2,(uint8_t *)((long)&uStack_18 + 7));
  base_xor(registers,uStack_18._7_1_);
  return '\0';
}

Assistant:

uint8_t zeropageX_SRE(cpu_registers* registers) {
    uint8_t data = fetch_zeropageX(registers);
    base_shift_right(registers, &data);
    base_store(calc_zeropageX_address(registers), &data);
    base_xor(registers, data);
    return ZERO_EXTRA_CYCLES;
}